

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O0

BmsParseInvalidCharAsHeaderOrBarException * __thiscall
BmsParseInvalidCharAsHeaderOrBarException::Message_abi_cxx11_
          (BmsParseInvalidCharAsHeaderOrBarException *this)

{
  ostream *poVar1;
  string *psVar2;
  BmsParseInvalidCharException *in_RSI;
  stringstream local_1a0 [8];
  stringstream os;
  ostream local_190 [384];
  BmsParseInvalidCharAsHeaderOrBarException *this_local;
  
  this_local = this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,anon_var_dwarf_2c3e2);
  psVar2 = BmsParseInvalidCharException::GetString_abi_cxx11_(in_RSI);
  std::operator<<(poVar1,(string *)psVar2);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return this;
}

Assistant:

std::string
BmsParseInvalidCharAsHeaderOrBarException::Message( void ) const
{
  std::stringstream os;
  os << "ヘッダ名または小節番号として不正な文字が指定されました。文字列 : " << this->GetString();
  return os.str();
}